

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int buffer_push_encrypted_records
              (ptls_buffer_t *buf,uint8_t type,uint8_t *src,size_t len,
              st_ptls_traffic_protection_t *enc)

{
  uint8_t *puVar1;
  byte bVar2;
  uint8_t *puVar3;
  st_ptls_aead_algorithm_t *psVar4;
  st_ptls_aead_context_t *psVar5;
  char cVar6;
  byte bVar9;
  byte bVar13;
  short sVar15;
  ushort uVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  unkbyte10 Var21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  undefined1 auVar25 [14];
  undefined4 uVar26;
  short sVar27;
  undefined1 auVar28 [16];
  int iVar29;
  size_t sVar30;
  ulong uVar31;
  ulong uVar32;
  size_t inlen;
  ulong uVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ulong uVar41;
  undefined1 auVar42 [14];
  undefined1 auVar43 [14];
  ulong uVar44;
  ulong uVar45;
  uint8_t aad [13];
  size_t local_40;
  byte bVar7;
  char cVar8;
  byte bVar10;
  char cVar11;
  char cVar12;
  byte bVar14;
  
  if (len != 0) {
    do {
      inlen = 0x4000;
      if (len < 0x4000) {
        inlen = len;
      }
      bVar2 = enc->field_0x58;
      iVar29 = ptls_buffer_reserve_aligned(buf,3,'\0');
      if ((bVar2 & 1) == 0) {
        if (iVar29 != 0) {
          return iVar29;
        }
        puVar3 = buf->base;
        sVar30 = buf->off;
        puVar1 = puVar3 + sVar30;
        puVar1[0] = '\x17';
        puVar1[1] = '\x03';
        puVar3[sVar30 + 2] = '\x03';
        buf->off = buf->off + 3;
        iVar29 = ptls_buffer_reserve_aligned(buf,2,'\0');
        if (iVar29 != 0) {
          return iVar29;
        }
        puVar1 = buf->base;
        sVar30 = buf->off;
        (puVar1 + sVar30)[0] = '\0';
        (puVar1 + sVar30)[1] = '\0';
        local_40 = buf->off;
        buf->off = local_40 + 2;
        psVar4 = enc->aead->algo;
        iVar29 = ptls_buffer_reserve_aligned(buf,inlen + psVar4->tag_size + 1,psVar4->align_bits);
        if (iVar29 != 0) {
          return iVar29;
        }
        sVar30 = aead_encrypt(enc,buf->base + buf->off,src,inlen,type);
        sVar30 = sVar30 + buf->off;
        buf->off = sVar30;
        uVar31 = sVar30 - (local_40 + 2);
      }
      else {
        if (iVar29 != 0) {
          return iVar29;
        }
        puVar1 = buf->base;
        sVar30 = buf->off;
        puVar1[sVar30] = type;
        puVar1 = puVar1 + sVar30 + 1;
        puVar1[0] = '\x03';
        puVar1[1] = '\x03';
        buf->off = buf->off + 3;
        iVar29 = ptls_buffer_reserve_aligned(buf,2,'\0');
        if (iVar29 != 0) {
          return iVar29;
        }
        puVar1 = buf->base;
        sVar30 = buf->off;
        (puVar1 + sVar30)[0] = '\0';
        (puVar1 + sVar30)[1] = '\0';
        local_40 = buf->off;
        buf->off = local_40 + 2;
        psVar4 = enc->aead->algo;
        iVar29 = ptls_buffer_reserve_aligned
                           (buf,(psVar4->tls12).record_iv_size + inlen + psVar4->tag_size,
                            psVar4->align_bits);
        auVar28 = _DAT_00124130;
        if (iVar29 != 0) {
          return iVar29;
        }
        sVar30 = (enc->aead->algo->tls12).record_iv_size;
        uVar31 = (ulong)DAT_00124130;
        uVar45 = DAT_00124130._8_8_;
        if (sVar30 == 0) {
          uVar32 = enc->seq;
          uVar33 = uVar32;
        }
        else {
          if (sVar30 != 8) {
            __assert_fail("enc->aead->algo->tls12.record_iv_size == 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                          ,0x30b,
                          "int buffer_push_encrypted_records(ptls_buffer_t *, uint8_t, const uint8_t *, size_t, struct st_ptls_traffic_protection_t *)"
                         );
          }
          uVar33 = enc->tls12_enc_record_iv;
          auVar39._0_8_ = uVar33 >> 8;
          auVar39._8_8_ = uVar33;
          enc->tls12_enc_record_iv = uVar33 + 1;
          auVar39 = auVar39 & auVar28;
          uVar32 = uVar33 >> 0x18 & uVar31;
          uVar37 = uVar33 >> 0x10 & uVar45;
          cVar34 = (char)(uVar37 >> 0x10);
          cVar35 = (char)(uVar37 >> 0x20);
          Var21 = CONCAT19((char)(uVar37 >> 8),CONCAT18((char)uVar37,uVar32));
          auVar22[10] = cVar34;
          auVar22._0_10_ = Var21;
          auVar22[0xb] = (char)(uVar37 >> 0x18);
          auVar23[0xc] = cVar35;
          auVar23._0_12_ = auVar22;
          auVar23[0xd] = (char)(uVar37 >> 0x28);
          sVar15 = (short)uVar32;
          cVar6 = (0 < sVar15) * (sVar15 < 0x100) * (char)uVar32 - (0xff < sVar15);
          sVar15 = (short)(uVar32 >> 0x10);
          uVar16 = (ushort)(uVar32 >> 0x20);
          bVar2 = (uVar16 != 0) * (uVar16 < 0x100) * (char)(uVar32 >> 0x20) - (0xff < uVar16);
          sVar17 = (short)((unkuint10)Var21 >> 0x40);
          cVar36 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar37 - (0xff < sVar17);
          sVar18 = auVar22._10_2_;
          sVar17 = auVar23._12_2_;
          bVar7 = (0 < sVar17) * (sVar17 < 0x100) * cVar35 - (0xff < sVar17);
          sVar17 = auVar39._0_2_;
          cVar35 = (0 < sVar17) * (sVar17 < 0x100) * auVar39[0] - (0xff < sVar17);
          sVar19 = auVar39._2_2_;
          sVar17 = auVar39._4_2_;
          cVar8 = (0 < sVar17) * (sVar17 < 0x100) * auVar39[4] - (0xff < sVar17);
          sVar20 = auVar39._6_2_;
          uVar37 = uVar33 >> 0x28 & uVar31;
          uVar38 = (ulong)(((unkuint9)(uint)(uVar33 >> 0x20) << 0x28) >> 0x28) & uVar45;
          uVar41 = uVar33 >> 0x38 & uVar31;
          uVar44 = (ulong)(((unkuint9)(ushort)(uVar33 >> 0x30) << 0x38) >> 0x38) & uVar45;
          uVar16 = (ushort)uVar41;
          bVar9 = (uVar16 != 0) * (uVar16 < 0x100) * (char)uVar41 - (0xff < uVar16);
          sVar17 = (short)uVar44;
          bVar10 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar44 - (0xff < sVar17);
          sVar17 = (short)uVar37;
          cVar11 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar37 - (0xff < sVar17);
          uVar16 = (ushort)(uVar37 >> 0x10);
          uVar16 = CONCAT11((uVar16 != 0) * (uVar16 < 0x100) * (char)(uVar37 >> 0x10) -
                            (0xff < uVar16),cVar11);
          auVar42._0_12_ = ZEXT212(uVar16) << 0x40;
          sVar17 = (short)uVar38;
          cVar12 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar38 - (0xff < sVar17);
          auVar42[0xc] = cVar12;
          sVar17 = (short)(uVar38 >> 0x10);
          auVar42[0xd] = (0 < sVar17) * (sVar17 < 0x100) * (char)(uVar38 >> 0x10) - (0xff < sVar17);
          sVar17 = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * (char)(uVar32 >> 0x10) -
                            (0xff < sVar15),cVar6);
          sVar27 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * cVar34 - (0xff < sVar18),cVar36);
          sVar18 = CONCAT11((0 < sVar19) * (sVar19 < 0x100) * auVar39[2] - (0xff < sVar19),cVar35);
          bVar13 = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
          bVar14 = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
          bVar10 = (0 < (short)uVar16) * ((short)uVar16 < 0x100) * cVar11 - (0xff < (short)uVar16);
          sVar15 = auVar42._12_2_;
          bVar9 = (0 < sVar15) * (sVar15 < 0x100) * cVar12 - (0xff < sVar15);
          cVar6 = (0 < sVar17) * (sVar17 < 0x100) * cVar6 - (0xff < sVar17);
          sVar19 = CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),cVar6);
          cVar36 = (0 < sVar27) * (sVar27 < 0x100) * cVar36 - (0xff < sVar27);
          uVar26 = CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                            CONCAT12(cVar36,sVar19));
          cVar35 = (0 < sVar18) * (sVar18 < 0x100) * cVar35 - (0xff < sVar18);
          sVar17 = (short)(CONCAT13((0 < sVar20) * (sVar20 < 0x100) * auVar39[6] - (0xff < sVar20),
                                    CONCAT12(cVar8,sVar18)) >> 0x10);
          sVar15 = (short)((uint)uVar26 >> 0x10);
          sVar17 = (short)(CONCAT15((0 < sVar17) * (sVar17 < 0x100) * cVar8 - (0xff < sVar17),
                                    CONCAT14(cVar35,uVar26)) >> 0x20);
          *(ulong *)(buf->base + buf->off) =
               (ulong)CONCAT16((0 < sVar17) * (sVar17 < 0x100) * cVar35 - (0xff < sVar17),
                               CONCAT15((0 < sVar15) * (sVar15 < 0x100) * cVar36 - (0xff < sVar15),
                                        CONCAT14((0 < sVar19) * (sVar19 < 0x100) * cVar6 -
                                                 (0xff < sVar19),
                                                 CONCAT13((bVar9 != 0) * (bVar9 < 0x100) * bVar9 -
                                                          (0xff < bVar9),
                                                          CONCAT12((bVar10 != 0) * (bVar10 < 0x100)
                                                                   * bVar10 - (0xff < bVar10),
                                                                   CONCAT11((bVar14 != 0) *
                                                                            (bVar14 < 0x100) *
                                                                            bVar14 - (0xff < bVar14)
                                                                            ,(bVar13 != 0) *
                                                                             (bVar13 < 0x100) *
                                                                             bVar13 - (0xff < bVar13
                                                                                      )))))));
          buf->off = buf->off + 8;
          uVar32 = enc->seq;
        }
        auVar40._0_8_ = uVar32 >> 8;
        auVar40._8_8_ = uVar32;
        auVar40 = auVar40 & auVar28;
        uVar37 = uVar32 >> 0x18 & uVar31;
        uVar38 = uVar32 >> 0x10 & uVar45;
        cVar34 = (char)(uVar38 >> 0x10);
        cVar36 = (char)(uVar38 >> 0x20);
        Var21 = CONCAT19((char)(uVar38 >> 8),CONCAT18((char)uVar38,uVar37));
        auVar24[10] = cVar34;
        auVar24._0_10_ = Var21;
        auVar24[0xb] = (char)(uVar38 >> 0x18);
        auVar25[0xc] = cVar36;
        auVar25._0_12_ = auVar24;
        auVar25[0xd] = (char)(uVar38 >> 0x28);
        sVar15 = (short)uVar37;
        cVar6 = (0 < sVar15) * (sVar15 < 0x100) * (char)uVar37 - (0xff < sVar15);
        sVar15 = (short)(uVar37 >> 0x10);
        uVar16 = (ushort)(uVar37 >> 0x20);
        bVar2 = (uVar16 != 0) * (uVar16 < 0x100) * (char)(uVar37 >> 0x20) - (0xff < uVar16);
        sVar17 = (short)((unkuint10)Var21 >> 0x40);
        cVar8 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar38 - (0xff < sVar17);
        sVar18 = auVar24._10_2_;
        sVar17 = auVar25._12_2_;
        bVar7 = (0 < sVar17) * (sVar17 < 0x100) * cVar36 - (0xff < sVar17);
        sVar17 = auVar40._0_2_;
        cVar36 = (0 < sVar17) * (sVar17 < 0x100) * auVar40[0] - (0xff < sVar17);
        sVar19 = auVar40._2_2_;
        sVar17 = auVar40._4_2_;
        cVar35 = (0 < sVar17) * (sVar17 < 0x100) * auVar40[4] - (0xff < sVar17);
        sVar20 = auVar40._6_2_;
        uVar38 = uVar32 >> 0x28 & uVar31;
        uVar41 = (ulong)(((unkuint9)(uint)(uVar32 >> 0x20) << 0x28) >> 0x28) & uVar45;
        uVar31 = uVar32 >> 0x38 & uVar31;
        uVar45 = (ulong)(((unkuint9)(ushort)(uVar32 >> 0x30) << 0x38) >> 0x38) & uVar45;
        uVar16 = (ushort)uVar31;
        bVar9 = (uVar16 != 0) * (uVar16 < 0x100) * (char)uVar31 - (0xff < uVar16);
        sVar17 = (short)uVar45;
        bVar10 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar45 - (0xff < sVar17);
        sVar17 = (short)uVar38;
        cVar11 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar38 - (0xff < sVar17);
        uVar16 = (ushort)(uVar38 >> 0x10);
        uVar16 = CONCAT11((uVar16 != 0) * (uVar16 < 0x100) * (char)(uVar38 >> 0x10) -
                          (0xff < uVar16),cVar11);
        auVar43._0_12_ = ZEXT212(uVar16) << 0x40;
        sVar17 = (short)uVar41;
        cVar12 = (0 < sVar17) * (sVar17 < 0x100) * (char)uVar41 - (0xff < sVar17);
        auVar43[0xc] = cVar12;
        sVar17 = (short)(uVar41 >> 0x10);
        auVar43[0xd] = (0 < sVar17) * (sVar17 < 0x100) * (char)(uVar41 >> 0x10) - (0xff < sVar17);
        sVar17 = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * (char)(uVar37 >> 0x10) - (0xff < sVar15)
                          ,cVar6);
        sVar27 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * cVar34 - (0xff < sVar18),cVar8);
        sVar18 = CONCAT11((0 < sVar19) * (sVar19 < 0x100) * auVar40[2] - (0xff < sVar19),cVar36);
        bVar9 = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
        bVar10 = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
        bVar14 = (0 < (short)uVar16) * ((short)uVar16 < 0x100) * cVar11 - (0xff < (short)uVar16);
        sVar15 = auVar43._12_2_;
        bVar13 = (0 < sVar15) * (sVar15 < 0x100) * cVar12 - (0xff < sVar15);
        cVar6 = (0 < sVar17) * (sVar17 < 0x100) * cVar6 - (0xff < sVar17);
        sVar19 = CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),cVar6);
        cVar8 = (0 < sVar27) * (sVar27 < 0x100) * cVar8 - (0xff < sVar27);
        uVar26 = CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                          CONCAT12(cVar8,sVar19));
        cVar36 = (0 < sVar18) * (sVar18 < 0x100) * cVar36 - (0xff < sVar18);
        sVar17 = (short)(CONCAT13((0 < sVar20) * (sVar20 < 0x100) * auVar40[6] - (0xff < sVar20),
                                  CONCAT12(cVar35,sVar18)) >> 0x10);
        sVar15 = (short)((uint)uVar26 >> 0x10);
        sVar17 = (short)(CONCAT15((0 < sVar17) * (sVar17 < 0x100) * cVar35 - (0xff < sVar17),
                                  CONCAT14(cVar36,uVar26)) >> 0x20);
        aad._0_8_ = ZEXT78(CONCAT16((0 < sVar17) * (sVar17 < 0x100) * cVar36 - (0xff < sVar17),
                                    CONCAT15((0 < sVar15) * (sVar15 < 0x100) * cVar8 -
                                             (0xff < sVar15),
                                             CONCAT14((0 < sVar19) * (sVar19 < 0x100) * cVar6 -
                                                      (0xff < sVar19),
                                                      CONCAT13((bVar13 != 0) * (bVar13 < 0x100) *
                                                               bVar13 - (0xff < bVar13),
                                                               CONCAT12((bVar14 != 0) *
                                                                        (bVar14 < 0x100) * bVar14 -
                                                                        (0xff < bVar14),
                                                                        CONCAT11((bVar10 != 0) *
                                                                                 (bVar10 < 0x100) *
                                                                                 bVar10 - (0xff < 
                                                  bVar10),(bVar9 != 0) * (bVar9 < 0x100) * bVar9 -
                                                          (0xff < bVar9))))))));
        aad[9] = '\x03';
        aad[10] = '\x03';
        aad[0xb] = (uint8_t)(inlen >> 8);
        aad[0xc] = (uint8_t)inlen;
        psVar5 = enc->aead;
        aad[8] = type;
        (*psVar5->do_encrypt)
                  (psVar5,buf->base + buf->off,src,inlen,uVar33,aad,0xd,
                   (ptls_aead_supplementary_encryption_t *)0x0);
        sVar30 = psVar5->algo->tag_size + inlen + buf->off;
        buf->off = sVar30;
        enc->seq = enc->seq + 1;
        uVar31 = sVar30 - (local_40 + 2);
      }
      if (0xffff < uVar31) {
        return 0x20c;
      }
      buf->base[local_40] = (uint8_t)(uVar31 >> 8);
      buf->base[local_40 + 1] = (uint8_t)uVar31;
      src = src + inlen;
      len = len - inlen;
    } while (len != 0);
  }
  return 0;
}

Assistant:

static int buffer_push_encrypted_records(ptls_buffer_t *buf, uint8_t type, const uint8_t *src, size_t len,
                                         struct st_ptls_traffic_protection_t *enc)
{
    int ret = 0;

    while (len != 0) {
        size_t chunk_size = len;
        if (chunk_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            chunk_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        if (enc->tls12) {
            buffer_push_record(buf, type, {
                /* reserve memory */
                if ((ret = ptls_buffer_reserve_aligned(
                         buf, enc->aead->algo->tls12.record_iv_size + chunk_size + enc->aead->algo->tag_size,
                         enc->aead->algo->align_bits)) != 0)
                    goto Exit;
                /* determine nonce, as well as prepending that walue as the record IV (AES-GCM) */
                uint64_t nonce;
                if (enc->aead->algo->tls12.record_iv_size != 0) {
                    assert(enc->aead->algo->tls12.record_iv_size == 8);
                    nonce = enc->tls12_enc_record_iv++;
                    encode64(buf->base + buf->off, nonce);
                    buf->off += 8;
                } else {
                    nonce = enc->seq;
                }
                /* build AAD */
                uint8_t aad[PTLS_TLS12_AAD_SIZE];
                build_tls12_aad(aad, type, enc->seq, (uint16_t)chunk_size);
                /* encrypt */
                buf->off += ptls_aead_encrypt(enc->aead, buf->base + buf->off, src, chunk_size, nonce, aad, sizeof(aad));
                ++enc->seq;
            });
        } else {
            buffer_push_record(buf, PTLS_CONTENT_TYPE_APPDATA, {
                if ((ret = ptls_buffer_reserve_aligned(buf, chunk_size + enc->aead->algo->tag_size + 1,
                                                       enc->aead->algo->align_bits)) != 0)
                    goto Exit;
                buf->off += aead_encrypt(enc, buf->base + buf->off, src, chunk_size, type);
            });
        }
        src += chunk_size;
        len -= chunk_size;
    }

Exit:
    return ret;
}